

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

void __thiscall http::Page::DumpData(Page *this,char *buffer,size_t length)

{
  ostream *poVar1;
  string local_88 [48];
  string local_58 [32];
  ostream *local_38;
  ostream *out;
  size_t j;
  size_t i;
  size_t length_local;
  char *buffer_local;
  Page *this_local;
  
  i = length;
  length_local = (size_t)buffer;
  buffer_local = (char *)this;
  local_38 = get_output_stream(this);
  j = 0;
  out = (ostream *)0x0;
  std::operator<<(local_38,"<code>\n");
  do {
    poVar1 = local_38;
    if (i < j + 1) {
      std::operator<<(local_38,"</code>\n");
      return;
    }
    to_hex<unsigned_short>((unsigned_short)local_58,j & 0xffff);
    poVar1 = std::operator<<(poVar1,local_58);
    std::operator<<(poVar1," ");
    std::__cxx11::string::~string(local_58);
    for (out = (ostream *)0x0; poVar1 = local_38, out < (ostream *)0x10; out = out + 1) {
      if (out + j < i) {
        to_hex<char>((char)local_88,(ulong)(uint)(int)(char)out[length_local + j]);
        poVar1 = std::operator<<(poVar1,local_88);
        std::operator<<(poVar1," ");
        std::__cxx11::string::~string(local_88);
      }
      else {
        std::operator<<(local_38,"   ");
      }
      if (out == (ostream *)0x7) {
        std::operator<<(local_38,"- ");
      }
    }
    std::operator<<(local_38,"  ");
    for (out = (ostream *)0x0; out < (ostream *)0x10; out = out + 1) {
      if (((char)out[length_local + j] < ' ') || ('~' < (char)out[length_local + j])) {
        std::operator<<(local_38,".");
      }
      else {
        std::operator<<(local_38,(char)out[length_local + j]);
      }
      if (out + j + 1 == (ostream *)i) break;
    }
    j = j + 0x10;
    std::operator<<(local_38,"<br>\n");
  } while( true );
}

Assistant:

void http::Page::DumpData(const char* buffer, size_t length)
{
    size_t i;
    size_t j;
    std::ostream& out = get_output_stream();

    i = 0;
    j = 0;
    out << "<code>\n";
    while (i + 1 <= length)
    {
        out << to_hex((uint16_t)i) << " ";
        for (j = 0; j < 16; j++)
        {
            if (i + j < length)
            {
                out << to_hex(buffer[i + j]) << " ";
            }
            else
            {
                out << "   ";
            }

            if (j == 7)
            {
                out << "- ";
            }
        }
        out << "  ";
        for (j = 0; j < 16; j++)
        {
            if (buffer[i + j] >= 0x20 && buffer[i + j] <= 0x7E)
            {
                out << buffer[i + j];
            }
            else
            {
                out << ".";
            }
            if (i + j + 1 == length)
            {
                break;
            }
        }

        i += 16;

        out << "<br>\n";
    }
    out << "</code>\n";
}